

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

ClippedEdge * __thiscall MutableS2ShapeIndex::EdgeAllocator::NewClippedEdge(EdgeAllocator *this)

{
  size_t sVar1;
  pointer puVar2;
  ClippedEdge *local_18;
  
  sVar1 = this->size_;
  puVar2 = (this->clipped_edges_).
           super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar1 == (long)(this->clipped_edges_).
                     super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) {
    local_18 = (ClippedEdge *)operator_new(0x28);
    (local_18->bound).bounds_[0].bounds_.c_[0] = 1.0;
    (local_18->bound).bounds_[0].bounds_.c_[1] = 0.0;
    (local_18->bound).bounds_[1].bounds_.c_[0] = 1.0;
    (local_18->bound).bounds_[1].bounds_.c_[1] = 0.0;
    std::
    vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
    ::emplace_back<MutableS2ShapeIndex::ClippedEdge*>
              ((vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
                *)&this->clipped_edges_,&local_18);
    sVar1 = this->size_;
    puVar2 = (this->clipped_edges_).
             super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  this->size_ = sVar1 + 1;
  return (ClippedEdge *)
         ((_Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
           )puVar2[sVar1]._M_t.
            super___uniq_ptr_impl<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
            ._M_t).
         super__Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
  ;
}

Assistant:

ClippedEdge* NewClippedEdge() {
    if (size_ == clipped_edges_.size()) {
      clipped_edges_.emplace_back(new ClippedEdge);
    }
    return clipped_edges_[size_++].get();
  }